

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-gost3411.c
# Opt level: O3

void pp_crypto_hash_gost3411_process(PHashGOST3411 *ctx,puint32 *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  
  uVar30 = ctx->hash[0];
  uVar45 = ctx->hash[2];
  uVar48 = ctx->hash[4];
  uVar6 = *data;
  uVar3 = data[2];
  uVar5 = data[4];
  uVar13 = uVar6 ^ uVar30;
  uVar1 = uVar3 ^ uVar45;
  uVar7 = uVar5 ^ uVar48;
  uVar35 = ctx->hash[6];
  uVar4 = data[6];
  uVar40 = uVar4 ^ uVar35;
  uVar31 = uVar40 << 0x18 | (uVar7 & 0xff) << 0x10 | (uVar1 & 0xff) << 8 | uVar13 & 0xff;
  uVar37 = (uVar40 & 0xff00) << 0x10 | (uVar7 & 0xff00) << 8 | uVar1 & 0xff00 | uVar13 >> 8 & 0xff;
  uVar27 = (uVar40 & 0xff0000) << 8 | uVar7 & 0xff0000 | uVar1 >> 8 & 0xff00 | uVar13 >> 0x10 & 0xff
  ;
  uVar41 = uVar40 & 0xff000000 | uVar7 >> 8 & 0xff0000 | uVar1 >> 0x10 & 0xff00 | uVar13 >> 0x18;
  uVar7 = ctx->hash[1];
  uVar1 = data[1];
  uVar8 = uVar1 ^ uVar7;
  uVar13 = ctx->hash[3];
  uVar40 = data[3];
  uVar2 = uVar40 ^ uVar13;
  uVar16 = ctx->hash[5];
  uVar43 = data[5];
  uVar14 = uVar43 ^ uVar16;
  uVar12 = data[7];
  uVar11 = ctx->hash[7];
  uVar36 = uVar12 ^ uVar11;
  uVar17 = uVar36 << 0x18 | (uVar14 & 0xff) << 0x10 | (uVar2 & 0xff) << 8 | uVar8 & 0xff;
  uVar18 = (uVar36 & 0xff00) << 0x10 | (uVar14 & 0xff00) << 8 | uVar2 & 0xff00 | uVar8 >> 8 & 0xff;
  uVar38 = (uVar36 & 0xff0000) << 8 | uVar14 & 0xff0000 | uVar2 >> 8 & 0xff00 | uVar8 >> 0x10 & 0xff
  ;
  uVar46 = uVar36 & 0xff000000 | uVar14 >> 8 & 0xff0000 | uVar2 >> 0x10 & 0xff00 | uVar8 >> 0x18;
  uVar2 = uVar5 ^ uVar45;
  uVar9 = uVar3 ^ uVar6;
  uVar8 = uVar9 ^ uVar35;
  uVar14 = uVar4 ^ uVar48;
  uVar36 = uVar5 ^ uVar3 ^ uVar45 ^ uVar30;
  uVar19 = uVar36 << 0x18 | (uVar8 & 0xff) << 0x10 | uVar2 & 0xff | (uVar14 & 0xff) << 8;
  uVar20 = (uVar36 & 0xff00) << 0x10 | (uVar8 & 0xff00) << 8 | uVar2 >> 8 & 0xff | uVar14 & 0xff00;
  uVar21 = (uVar36 & 0xff0000) << 8 | uVar8 & 0xff0000 | uVar2 >> 0x10 & 0xff | uVar14 >> 8 & 0xff00
  ;
  uVar32 = uVar36 & 0xff000000 | uVar8 >> 8 & 0xff0000 | uVar2 >> 0x18 | uVar14 >> 0x10 & 0xff00;
  uVar10 = uVar43 ^ uVar13;
  uVar2 = uVar40 ^ uVar1;
  uVar39 = uVar2 ^ uVar11;
  uVar42 = uVar12 ^ uVar16;
  uVar8 = uVar43 ^ uVar40 ^ uVar13 ^ uVar7;
  uVar14 = uVar8 << 0x18 | (uVar39 & 0xff) << 0x10 | uVar10 & 0xff | (uVar42 & 0xff) << 8;
  uVar36 = uVar31 + uVar30;
  uVar15 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar22 = (uVar15 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar15) >> 0x15) ^
           uVar7;
  uVar15 = uVar22 + uVar37;
  uVar36 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar15 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar15 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar15 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar15 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar15 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar15 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar15 & 0xf];
  uVar28 = (uVar36 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar15 >> 0x1c] << 0x1c | uVar36) >> 0x15) ^
           uVar30;
  uVar15 = uVar28 + uVar27;
  uVar36 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar15 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar15 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar15 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar15 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar15 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar15 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar15 & 0xf];
  uVar22 = (uVar36 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar15 >> 0x1c] << 0x1c | uVar36) >> 0x15) ^
           uVar22;
  uVar36 = uVar41 + uVar22;
  uVar15 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar28 = (uVar15 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar15) >> 0x15) ^
           uVar28;
  uVar36 = uVar17 + uVar28;
  uVar15 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar22 = (uVar15 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar15) >> 0x15) ^
           uVar22;
  uVar36 = uVar22 + uVar18;
  uVar15 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar28 = (uVar15 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar15) >> 0x15) ^
           uVar28;
  uVar36 = uVar38 + uVar28;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar15 = (uVar8 & 0xff00) << 0x10 | (uVar39 & 0xff00) << 8 | uVar10 >> 8 & 0xff | uVar42 & 0xff00;
  uVar22 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar22;
  uVar36 = uVar46 + uVar22;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar28 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar28;
  uVar36 = uVar28 + uVar31;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar22 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar22;
  uVar36 = uVar22 + uVar37;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar28 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar28;
  uVar36 = uVar28 + uVar27;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar22 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar22;
  uVar36 = uVar22 + uVar41;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar28 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar28;
  uVar36 = uVar28 + uVar17;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar22 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar22;
  uVar36 = uVar18 + uVar22;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar28 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar28;
  uVar36 = uVar28 + uVar38;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar22 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar22;
  uVar36 = uVar22 + uVar46;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar28 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar28;
  uVar36 = uVar28 + uVar31;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar33 = (uVar8 & 0xff0000) << 8 | uVar39 & 0xff0000 | uVar10 >> 0x10 & 0xff |
           uVar42 >> 8 & 0xff00;
  uVar22 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar22;
  uVar36 = uVar37 + uVar22;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar28 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar28;
  uVar36 = uVar27 + uVar28;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar22 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar22;
  uVar36 = uVar22 + uVar41;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar28 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar28;
  uVar36 = uVar28 + uVar17;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar22 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar22;
  uVar36 = uVar22 + uVar18;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar28 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar28;
  uVar36 = uVar28 + uVar38;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar22 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar22;
  uVar36 = uVar22 + uVar46;
  uVar23 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar28 = (uVar23 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar23) >> 0x15) ^
           uVar28;
  uVar46 = uVar46 + uVar28;
  uVar36 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar46 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar46 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar46 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar46 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar46 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar46 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar46 & 0xf];
  uVar22 = (uVar36 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar46 >> 0x1c] << 0x1c | uVar36) >> 0x15) ^
           uVar22;
  uVar38 = uVar38 + uVar22;
  uVar36 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar38 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar38 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar38 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar38 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar38 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar38 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar38 & 0xf];
  uVar49 = uVar8 & 0xff000000 | uVar39 >> 8 & 0xff0000 | uVar10 >> 0x18 | uVar42 >> 0x10 & 0xff00;
  uVar28 = (uVar36 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar38 >> 0x1c] << 0x1c | uVar36) >> 0x15) ^
           uVar28;
  uVar18 = uVar18 + uVar28;
  uVar8 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar18 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar18 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar18 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar18 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar18 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar18 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar18 & 0xf];
  uVar22 = (uVar8 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar18 >> 0x1c] << 0x1c | uVar8) >> 0x15) ^
           uVar22;
  uVar17 = uVar17 + uVar22;
  uVar8 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar17 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar17 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar17 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar17 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar17 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar17 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar17 & 0xf];
  uVar28 = (uVar8 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar17 >> 0x1c] << 0x1c | uVar8) >> 0x15) ^
           uVar28;
  uVar41 = uVar41 + uVar28;
  uVar8 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar41 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar41 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar41 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar41 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar41 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar41 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar41 & 0xf];
  uVar22 = (uVar8 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar41 >> 0x1c] << 0x1c | uVar8) >> 0x15) ^
           uVar22;
  uVar27 = uVar27 + uVar22;
  uVar8 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar27 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar27 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar27 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar27 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar27 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar27 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar27 & 0xf];
  uVar38 = uVar35 ^ 0xff00ff;
  uVar46 = uVar5 ^ uVar3 ^ uVar38;
  uVar39 = uVar9 ^ uVar48 ^ 0xff00ff00;
  uVar28 = (uVar8 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar27 >> 0x1c] << 0x1c | uVar8) >> 0x15) ^
           uVar28;
  uVar37 = uVar37 + uVar28;
  uVar8 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar37 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar37 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar37 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar37 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar37 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar37 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar37 & 0xf];
  uVar22 = (uVar8 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar37 >> 0x1c] << 0x1c | uVar8) >> 0x15) ^
           uVar22;
  uVar31 = uVar31 + uVar22;
  uVar8 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar31 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar31 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar31 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar31 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar31 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar31 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar31 & 0xf];
  uVar28 = (uVar8 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar31 >> 0x1c] << 0x1c | uVar8) >> 0x15) ^
           uVar28;
  uVar23 = uVar45 ^ uVar30 ^ 0xffff00;
  uVar10 = uVar4 ^ uVar5 ^ uVar23;
  uVar17 = uVar45 ^ uVar48 ^ 0xff;
  uVar37 = uVar4 ^ uVar9 ^ uVar17;
  uVar8 = uVar37 << 0x18 | (uVar10 & 0xff) << 0x10 | (uVar46 & 0xff) << 8 | uVar39 & 0xff;
  uVar18 = (uVar37 & 0xff00) << 0x10 | (uVar10 & 0xff00) << 8 | uVar46 & 0xff00 | uVar39 >> 8 & 0xff
  ;
  uVar36 = (uVar37 & 0xff0000) << 8 |
           uVar10 & 0xff0000 | uVar46 >> 8 & 0xff00 | uVar39 >> 0x10 & 0xff;
  uVar29 = uVar37 & 0xff000000 | uVar46 >> 0x10 & 0xff00 | uVar39 >> 0x18 | uVar10 >> 8 & 0xff0000;
  uVar31 = uVar11 ^ 0xff00ff;
  uVar27 = uVar43 ^ uVar40 ^ uVar31;
  uVar37 = uVar2 ^ uVar16 ^ 0xff00ff00;
  uVar41 = uVar13 ^ uVar7 ^ 0xff0000ff;
  uVar10 = uVar12 ^ uVar43 ^ uVar41;
  uVar34 = uVar13 ^ uVar16 ^ 0xff00ffff;
  uVar46 = uVar12 ^ uVar2 ^ uVar34;
  uVar24 = uVar46 << 0x18 | (uVar10 & 0xff) << 0x10 | (uVar27 & 0xff) << 8 | uVar37 & 0xff;
  uVar25 = (uVar46 & 0xff00) << 0x10 | (uVar10 & 0xff00) << 8 | uVar27 & 0xff00 | uVar37 >> 8 & 0xff
  ;
  uVar42 = (uVar46 & 0xff0000) << 8 |
           uVar10 & 0xff0000 | uVar27 >> 8 & 0xff00 | uVar37 >> 0x10 & 0xff;
  uVar37 = uVar46 & 0xff000000 | uVar27 >> 0x10 & 0xff00 | uVar37 >> 0x18 | uVar10 >> 8 & 0xff0000;
  uVar23 = uVar4 ^ uVar9 ^ uVar23;
  uVar41 = uVar12 ^ uVar2 ^ uVar41;
  uVar17 = uVar6 ^ uVar5 ^ uVar17;
  uVar34 = uVar1 ^ uVar43 ^ uVar34;
  uVar2 = uVar4 ^ uVar5 ^ uVar38;
  uVar10 = uVar3 ^ uVar4 ^ uVar38 ^ uVar48 ^ 0xff00ff00;
  uVar44 = uVar12 ^ uVar43 ^ uVar31;
  uVar47 = uVar40 ^ uVar12 ^ uVar31 ^ uVar16 ^ 0xff00ff00;
  uVar38 = uVar10 << 0x18 | (uVar17 & 0xff) << 0x10 | uVar2 & 0xff | (uVar23 & 0xff) << 8;
  uVar27 = (uVar10 & 0xff00) << 0x10 | (uVar17 & 0xff00) << 8 | uVar23 & 0xff00 | uVar2 >> 8 & 0xff;
  uVar31 = (uVar10 & 0xff0000) << 8 |
           uVar17 & 0xff0000 | uVar23 >> 8 & 0xff00 | uVar2 >> 0x10 & 0xff;
  uVar39 = uVar10 & 0xff000000 | uVar17 >> 8 & 0xff0000 | uVar2 >> 0x18 | uVar23 >> 0x10 & 0xff00;
  uVar46 = uVar47 << 0x18 | (uVar34 & 0xff) << 0x10 | uVar44 & 0xff | (uVar41 & 0xff) << 8;
  uVar2 = uVar19 + uVar45;
  uVar10 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar10 = (uVar10 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar10) >> 0x15) ^
           uVar13;
  uVar17 = uVar10 + uVar20;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar17 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar17 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar17 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar17 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar17 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar17 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar17 & 0xf];
  uVar17 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar17 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar45;
  uVar9 = uVar17 + uVar21;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar9 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar9 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar9 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar9 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar9 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar9 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar9 & 0xf];
  uVar10 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar9 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar10;
  uVar2 = uVar10 + uVar32;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar17 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar17;
  uVar2 = uVar17 + uVar14;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar10 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar10;
  uVar9 = uVar10 + uVar15;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar9 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar9 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar9 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar9 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar9 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar9 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar9 & 0xf];
  uVar17 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar9 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar17;
  uVar2 = uVar17 + uVar33;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar10 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar10;
  uVar2 = uVar49 + uVar10;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar17 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar17;
  uVar2 = uVar17 + uVar19;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar23 = (uVar47 & 0xff00) << 0x10 | (uVar34 & 0xff00) << 8 | uVar41 & 0xff00 | uVar44 >> 8 & 0xff
  ;
  uVar10 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar10;
  uVar2 = uVar20 + uVar10;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar17 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar17;
  uVar2 = uVar17 + uVar21;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar10 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar10;
  uVar2 = uVar32 + uVar10;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar17 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar17;
  uVar2 = uVar17 + uVar14;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar10 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar10;
  uVar2 = uVar10 + uVar15;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar17 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar17;
  uVar2 = uVar17 + uVar33;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar10 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar10;
  uVar2 = uVar10 + uVar49;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar17 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar17;
  uVar2 = uVar17 + uVar19;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar10 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar10;
  uVar2 = uVar20 + uVar10;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar17 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar17;
  uVar2 = uVar21 + uVar17;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar26 = (uVar47 & 0xff0000) << 8 |
           uVar34 & 0xff0000 | uVar41 >> 8 & 0xff00 | uVar44 >> 0x10 & 0xff;
  uVar10 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar10;
  uVar2 = uVar10 + uVar32;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar17 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar17;
  uVar2 = uVar14 + uVar17;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar10 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar10;
  uVar2 = uVar10 + uVar15;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar17 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar17;
  uVar2 = uVar17 + uVar33;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar10 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar10;
  uVar2 = uVar10 + uVar49;
  uVar9 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar17 = (uVar9 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar9) >> 0x15) ^
           uVar17;
  uVar49 = uVar49 + uVar17;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar49 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar49 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar49 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar49 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar49 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar49 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar49 & 0xf];
  uVar10 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar49 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar10;
  uVar33 = uVar33 + uVar10;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar33 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar33 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar33 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar33 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar33 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar33 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar33 & 0xf];
  uVar17 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar33 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar17;
  uVar15 = uVar15 + uVar17;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar15 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar15 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar15 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar15 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar15 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar15 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar15 & 0xf];
  uVar10 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar15 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar10;
  uVar14 = uVar14 + uVar10;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar14 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar14 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar14 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar14 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar14 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar14 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar14 & 0xf];
  uVar33 = uVar47 & 0xff000000 | uVar34 >> 8 & 0xff0000 | uVar44 >> 0x18 | uVar41 >> 0x10 & 0xff00;
  uVar17 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar14 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar17;
  uVar32 = uVar32 + uVar17;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar32 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar32 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar32 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar32 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar32 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar32 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar32 & 0xf];
  uVar10 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar32 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar10;
  uVar21 = uVar21 + uVar10;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar21 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar21 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar21 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar21 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar21 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar21 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar21 & 0xf];
  uVar17 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar21 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar17;
  uVar20 = uVar20 + uVar17;
  uVar2 = uVar8 + uVar48;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar9 = (uVar14 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
          uVar16;
  uVar14 = uVar9 + uVar18;
  uVar15 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar14 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar14 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar14 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar14 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar14 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar14 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar14 & 0xf];
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar20 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar20 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar20 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar20 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar20 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar20 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar20 & 0xf];
  uVar15 = (uVar15 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar14 >> 0x1c] << 0x1c | uVar15) >> 0x15) ^
           uVar48;
  uVar14 = uVar36 + uVar15;
  uVar41 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar14 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar14 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar14 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar14 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar14 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar14 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar14 & 0xf];
  uVar9 = (uVar41 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar14 >> 0x1c] << 0x1c | uVar41) >> 0x15) ^
          uVar9;
  uVar14 = uVar29 + uVar9;
  uVar41 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar14 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar14 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar14 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar14 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar14 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar14 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar14 & 0xf];
  uVar15 = (uVar41 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar14 >> 0x1c] << 0x1c | uVar41) >> 0x15) ^
           uVar15;
  uVar14 = uVar24 + uVar15;
  uVar41 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar14 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar14 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar14 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar14 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar14 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar14 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar14 & 0xf];
  uVar9 = (uVar41 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar14 >> 0x1c] << 0x1c | uVar41) >> 0x15) ^
          uVar9;
  uVar14 = uVar9 + uVar25;
  uVar41 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar14 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar14 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar14 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar14 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar14 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar14 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar14 & 0xf];
  uVar15 = (uVar41 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar14 >> 0x1c] << 0x1c | uVar41) >> 0x15) ^
           uVar15;
  uVar14 = uVar15 + uVar42;
  uVar41 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar14 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar14 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar14 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar14 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar14 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar14 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar14 & 0xf];
  uVar9 = (uVar41 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar14 >> 0x1c] << 0x1c | uVar41) >> 0x15) ^
          uVar9;
  uVar14 = uVar9 + uVar37;
  uVar41 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar14 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar14 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar14 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar14 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar14 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar14 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar14 & 0xf];
  uVar15 = (uVar41 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar14 >> 0x1c] << 0x1c | uVar41) >> 0x15) ^
           uVar15;
  uVar14 = uVar15 + uVar8;
  uVar41 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar14 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar14 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar14 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar14 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar14 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar14 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar14 & 0xf];
  uVar10 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar20 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar10;
  uVar9 = (uVar41 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar14 >> 0x1c] << 0x1c | uVar41) >> 0x15) ^
          uVar9;
  uVar2 = uVar9 + uVar18;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar15 = (uVar14 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
           uVar15;
  uVar2 = uVar15 + uVar36;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar19 = uVar19 + uVar10;
  uVar9 = (uVar14 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
          uVar9;
  uVar2 = uVar9 + uVar29;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar15 = (uVar14 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
           uVar15;
  uVar2 = uVar15 + uVar24;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar9 = (uVar14 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
          uVar9;
  uVar2 = uVar25 + uVar9;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar15 = (uVar14 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
           uVar15;
  uVar2 = uVar42 + uVar15;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar9 = (uVar14 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
          uVar9;
  uVar2 = uVar9 + uVar37;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar15 = (uVar14 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
           uVar15;
  uVar2 = uVar8 + uVar15;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar9 = (uVar14 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
          uVar9;
  uVar2 = uVar18 + uVar9;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar15 = (uVar14 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
           uVar15;
  uVar2 = uVar15 + uVar36;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar9 = (uVar14 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
          uVar9;
  uVar2 = uVar9 + uVar29;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar15 = (uVar14 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
           uVar15;
  uVar2 = uVar15 + uVar24;
  uVar41 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar19 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar19 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar19 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar19 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar19 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar19 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar19 & 0xf];
  uVar9 = (uVar41 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar41) >> 0x15) ^
          uVar9;
  uVar41 = uVar9 + uVar25;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar41 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar41 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar41 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar41 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar41 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar41 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar41 & 0xf];
  uVar15 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar41 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar15;
  uVar2 = uVar15 + uVar42;
  uVar41 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar9 = (uVar41 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar41) >> 0x15) ^
          uVar9;
  uVar2 = uVar9 + uVar37;
  uVar41 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar15 = (uVar41 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar41) >> 0x15) ^
           uVar15;
  uVar37 = uVar37 + uVar15;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar37 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar37 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar37 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar37 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar37 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar37 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar37 & 0xf];
  uVar9 = (uVar2 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar37 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
          uVar9;
  uVar42 = uVar42 + uVar9;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar42 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar42 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar42 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar42 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar42 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar42 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar42 & 0xf];
  uVar15 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar42 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar15;
  uVar25 = uVar25 + uVar15;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar25 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar25 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar25 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar25 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar25 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar25 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar25 & 0xf];
  uVar9 = (uVar2 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar25 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
          uVar9;
  uVar24 = uVar24 + uVar9;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar24 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar24 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar24 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar24 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar24 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar24 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar24 & 0xf];
  uVar17 = (uVar14 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar19 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
           uVar17;
  uVar15 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar24 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar15;
  uVar29 = uVar29 + uVar15;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar29 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar29 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar29 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar29 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar29 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar29 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar29 & 0xf];
  uVar9 = (uVar2 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar29 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
          uVar9;
  uVar36 = uVar36 + uVar9;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf];
  uVar15 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar15;
  uVar18 = uVar18 + uVar15;
  uVar2 = uVar35 + uVar38;
  uVar14 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar14 = (uVar14 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar14) >> 0x15) ^
           uVar11;
  uVar2 = uVar27 + uVar14;
  uVar36 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar36 = (uVar36 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar36) >> 0x15) ^
           uVar35;
  uVar2 = uVar31 + uVar36;
  uVar37 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar14 = (uVar37 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar37) >> 0x15) ^
           uVar14;
  uVar2 = uVar14 + uVar39;
  uVar37 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar36 = (uVar37 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar37) >> 0x15) ^
           uVar36;
  uVar2 = uVar46 + uVar36;
  uVar37 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar14 = (uVar37 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar37) >> 0x15) ^
           uVar14;
  uVar2 = uVar14 + uVar23;
  uVar37 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar41 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar18 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar18 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar18 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar18 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar18 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar18 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar18 & 0xf];
  uVar36 = (uVar37 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar37) >> 0x15) ^
           uVar36;
  uVar2 = uVar26 + uVar36;
  uVar37 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar14 = (uVar37 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar37) >> 0x15) ^
           uVar14;
  uVar2 = uVar33 + uVar14;
  uVar37 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar36 = (uVar37 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar37) >> 0x15) ^
           uVar36;
  uVar2 = uVar36 + uVar38;
  uVar37 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar14 = (uVar37 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar37) >> 0x15) ^
           uVar14;
  uVar2 = uVar14 + uVar27;
  uVar37 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar36 = (uVar37 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar37) >> 0x15) ^
           uVar36;
  uVar2 = uVar36 + uVar31;
  uVar37 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar14 = (uVar37 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar37) >> 0x15) ^
           uVar14;
  uVar2 = uVar14 + uVar39;
  uVar37 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar36 = (uVar37 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar37) >> 0x15) ^
           uVar36;
  uVar2 = uVar36 + uVar46;
  uVar37 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar9 = (uVar41 << 0xb |
          ((uint)pp_crypto_hash_gost3411_K_block[7][uVar18 >> 0x1c] << 0x1c | uVar41) >> 0x15) ^
          uVar9;
  uVar14 = (uVar37 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar37) >> 0x15) ^
           uVar14;
  uVar2 = uVar14 + uVar23;
  uVar18 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar36 = (uVar18 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar18) >> 0x15) ^
           uVar36;
  uVar2 = uVar36 + uVar26;
  uVar18 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar8 = uVar8 + uVar9;
  uVar14 = (uVar18 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar18) >> 0x15) ^
           uVar14;
  uVar2 = uVar33 + uVar14;
  uVar18 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar36 = (uVar18 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar18) >> 0x15) ^
           uVar36;
  uVar2 = uVar38 + uVar36;
  uVar18 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar14 = (uVar18 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar18) >> 0x15) ^
           uVar14;
  uVar2 = uVar14 + uVar27;
  uVar18 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar36 = (uVar18 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar18) >> 0x15) ^
           uVar36;
  uVar2 = uVar36 + uVar31;
  uVar18 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar14 = (uVar18 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar18) >> 0x15) ^
           uVar14;
  uVar2 = uVar14 + uVar39;
  uVar18 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar36 = (uVar18 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar18) >> 0x15) ^
           uVar36;
  uVar2 = uVar36 + uVar46;
  uVar18 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar14 = (uVar18 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar18) >> 0x15) ^
           uVar14;
  uVar2 = uVar14 + uVar23;
  uVar18 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar36 = (uVar18 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar18) >> 0x15) ^
           uVar36;
  uVar2 = uVar36 + uVar26;
  uVar18 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar14 = (uVar18 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar18) >> 0x15) ^
           uVar14;
  uVar2 = uVar14 + uVar33;
  uVar18 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar2 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar2 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar2 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar2 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar2 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar2 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar2 & 0xf];
  uVar36 = (uVar18 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar2 >> 0x1c] << 0x1c | uVar18) >> 0x15) ^
           uVar36;
  uVar33 = uVar33 + uVar36;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar33 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar33 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar33 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar33 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar33 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar33 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar33 & 0xf];
  uVar18 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar8 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[5][uVar8 >> 0x14 & 0xf] << 0x14 |
           (uint)pp_crypto_hash_gost3411_K_block[4][uVar8 >> 0x10 & 0xf] << 0x10 |
           (uint)pp_crypto_hash_gost3411_K_block[3][uVar8 >> 0xc & 0xf] << 0xc |
           (uint)pp_crypto_hash_gost3411_K_block[2][uVar8 >> 8 & 0xf] << 8 |
           (uint)pp_crypto_hash_gost3411_K_block[1][uVar8 >> 4 & 0xf] << 4 |
           (uint)pp_crypto_hash_gost3411_K_block[0][uVar8 & 0xf];
  uVar14 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar33 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar14;
  uVar26 = uVar26 + uVar14;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar26 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar26 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar26 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar26 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar26 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar26 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar26 & 0xf];
  uVar36 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar26 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar36;
  uVar23 = uVar23 + uVar36;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar23 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar23 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar23 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar23 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar23 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar23 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar23 & 0xf];
  uVar14 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar23 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar14;
  uVar46 = uVar46 + uVar14;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar46 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar46 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar46 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar46 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar46 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar46 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar46 & 0xf];
  uVar36 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar46 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar36;
  uVar39 = uVar39 + uVar36;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar39 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar39 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar39 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar39 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar39 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar39 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar39 & 0xf];
  uVar14 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar39 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar14;
  uVar31 = uVar31 + uVar14;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar31 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar31 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar31 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar31 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar31 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar31 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar31 & 0xf];
  uVar36 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar31 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar36;
  uVar27 = uVar27 + uVar36;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar27 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar27 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar27 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar27 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar27 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar27 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar27 & 0xf];
  uVar14 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar27 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar14;
  uVar38 = uVar38 + uVar14;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[6][uVar38 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar38 >> 0x14 & 0xf] << 0x14 |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar38 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar38 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar38 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar38 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[0][uVar38 & 0xf];
  uVar15 = (uVar18 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar8 >> 0x1c] << 0x1c | uVar18) >> 0x15) ^
           uVar15;
  uVar36 = (uVar2 << 0xb |
           ((uint)pp_crypto_hash_gost3411_K_block[7][uVar38 >> 0x1c] << 0x1c | uVar2) >> 0x15) ^
           uVar36;
  uVar2 = uVar22 >> 0x10;
  uVar8 = uVar22 << 0x10;
  uVar18 = uVar28 & 0xffff;
  uVar46 = uVar28 >> 0x10;
  uVar27 = uVar10 << 0x10;
  uVar37 = uVar10 >> 0x10;
  uVar6 = uVar6 ^ uVar14;
  uVar23 = uVar36 >> 0x10;
  uVar3 = uVar46 ^ uVar27 ^ uVar2 ^ uVar8 ^ uVar3 ^ uVar22 & 0xffff ^ uVar18 ^ uVar14;
  uVar38 = uVar27 ^ uVar37 ^ uVar17 << 0x10 ^
           uVar28 << 0x10 ^ uVar46 ^ uVar22 & 0xffff ^ uVar40 ^ uVar8 ^ uVar18 ^ uVar14;
  uVar40 = (uVar9 ^ uVar15) << 0x10 ^ uVar15 >> 0x10 ^
           (uVar17 ^ uVar9) >> 0x10 ^ uVar22 ^ uVar4 ^ uVar27 ^ uVar46 ^ uVar17 ^ uVar14;
  uVar4 = uVar14 >> 0x10;
  uVar27 = (uVar10 ^ uVar17) << 0x10 ^
           uVar5 ^ uVar8 ^ uVar2 ^ uVar46 ^ (uVar28 ^ uVar22) & 0xffff0000;
  uVar1 = uVar1 ^ uVar36;
  uVar46 = (uVar14 ^ uVar36) << 0x10;
  uVar10 = (uVar10 ^ uVar17) >> 0x10 ^
           uVar43 ^ uVar22 & 0xffff0000 ^ uVar2 ^ uVar8 ^ uVar18 ^ uVar10 ^ uVar36 & 0xffff0000;
  uVar2 = uVar40 ^ uVar4;
  uVar5 = uVar4 ^ uVar36 & 0xffff ^
          uVar15 << 0x10 ^ uVar9 >> 0x10 ^ uVar15 >> 0x10 ^
          uVar17 << 0x10 ^ uVar9 ^
          uVar37 ^ uVar18 ^ uVar22 & 0xffff0000 ^ uVar12 ^ uVar8 ^ uVar28 << 0x10;
  uVar43 = uVar36 << 0x10 ^ uVar5;
  uVar30 = (uVar1 << 0x10 | uVar6 >> 0x10) ^ uVar30;
  uVar7 = ((uVar3 ^ uVar23) << 0x10 | uVar1 >> 0x10) ^ uVar7;
  uVar45 = ((uVar4 ^ uVar36 ^ uVar23 ^ uVar38) << 0x10 | (uVar14 << 0x10 ^ uVar36 ^ uVar3) >> 0x10)
           ^ uVar45;
  uVar13 = (((uVar17 ^ uVar14 ^ uVar36) >> 0x10 ^ uVar37 ^ uVar36 & 0xffff ^ uVar27) << 0x10 |
           (uVar38 ^ uVar46) >> 0x10) ^ uVar13;
  uVar48 = (((uVar9 ^ uVar14 ^ uVar36) >> 0x10 ^ uVar10) << 0x10 |
           ((uVar14 ^ uVar9 ^ uVar36) << 0x10 ^ uVar27) >> 0x10) ^ uVar48;
  uVar16 = (((uVar17 ^ uVar9 ^ uVar15 ^ uVar14) << 0x10 ^ uVar10 ^ uVar36 << 0x10) >> 0x10 |
           uVar2 << 0x10) ^ uVar16;
  uVar35 = ((uVar5 ^ uVar23) << 0x10 | (uVar40 ^ uVar46) >> 0x10) ^ uVar35;
  uVar11 = (uVar6 ^ uVar1) & 0xffff0000 ^ uVar43 & 0xffff0000 ^ (uVar6 << 0x10 | uVar43 >> 0x10) ^
           uVar11;
  uVar6 = uVar30 & 0xffff0000 ^ uVar30 << 0x10;
  uVar5 = uVar30 >> 0x10 | uVar6;
  uVar17 = uVar7 & 0xffff0000;
  uVar36 = uVar7 >> 0x10;
  uVar4 = uVar45 >> 0x10;
  uVar18 = uVar13 << 0x10;
  uVar23 = (uVar2 ^ uVar1) << 0x10 ^ uVar11;
  uVar10 = uVar45 << 0x10;
  uVar1 = uVar13 >> 0x10;
  uVar9 = uVar48 << 0x10;
  uVar40 = uVar16 >> 0x10;
  uVar43 = uVar35 >> 0x10;
  uVar14 = uVar11 << 0x10;
  uVar12 = uVar35 << 0x10;
  uVar22 = uVar35 ^ uVar12;
  uVar15 = uVar48 >> 0x10;
  uVar8 = uVar43 ^ uVar14;
  uVar28 = uVar23 >> 0x10;
  uVar2 = uVar17 ^ uVar5 ^ uVar36 ^ uVar10 ^ uVar11 & 0xffff ^ uVar28;
  ctx->hash[0] = uVar16 ^ uVar40 ^ (uVar13 ^ uVar35) >> 0x10 ^ uVar14 ^ uVar9 ^ uVar2;
  uVar3 = uVar16 << 0x10;
  ctx->hash[1] = uVar23 & 0xffff0000 ^ uVar3 ^
                 uVar4 ^ uVar18 ^ uVar7 & 0xffff ^ uVar5 ^ uVar45 ^ uVar22 ^ uVar15 ^ uVar28;
  ctx->hash[2] = uVar9 ^ uVar40 ^ uVar28 ^
                 uVar11 & 0xffff ^ uVar14 ^
                 uVar35 ^ uVar1 ^ uVar43 ^
                 uVar36 ^ uVar17 ^ (uVar30 & 0xffff | uVar30 << 0x10) ^ uVar7 << 0x10 ^
                 uVar13 ^ uVar10;
  uVar5 = uVar7 << 0x10 | uVar30 >> 0x10;
  ctx->hash[3] = uVar15 ^ uVar3 ^ uVar45 ^ uVar4 ^ uVar18 ^ uVar12 ^ uVar48 ^ uVar2;
  ctx->hash[4] = uVar9 ^ uVar16 ^ uVar40 ^
                 uVar18 ^ uVar1 ^ uVar12 ^ uVar4 ^ uVar13 ^ uVar7 ^ uVar45 ^ uVar5 ^ uVar8;
  ctx->hash[5] = uVar23 & 0xffff0000 ^ uVar15 ^ uVar3 ^
                 uVar14 ^ uVar48 ^ uVar9 ^
                 uVar43 ^ uVar22 ^
                 uVar45 ^ uVar13 ^ uVar10 ^ uVar1 ^ (uVar7 << 0x10 ^ uVar6 ^ uVar17 | uVar36) ^
                 uVar28;
  ctx->hash[6] = uVar3 ^ uVar40 ^
                 uVar15 ^ uVar48 ^ uVar23 ^ uVar16 ^
                 uVar45 ^ uVar30 ^ uVar13 ^ (uVar13 << 0x10 | uVar45 >> 0x10) ^ uVar22 ^ uVar8;
  ctx->hash[7] = uVar9 ^ uVar48 ^ uVar23 ^ uVar16 ^
                 uVar12 ^ uVar1 ^ uVar36 ^ uVar30 ^ uVar5 ^ uVar13 ^ uVar10 ^ uVar8 ^ uVar40;
  return;
}

Assistant:

static void pp_crypto_hash_gost3411_process (PHashGOST3411	*ctx,
					     const puint32	data[8])
{
	puint32	U[8];
	puint32	V[8];
	puint32	W[8];
	puint32	S[8];
	puint32	K[4][8];

	memcpy (U, ctx->hash, 32);
	memcpy (V, data, 32);

	/* Generate first key: P (U xor V) */
	W[0] = U[0] ^ V[0];
	W[1] = U[1] ^ V[1];
	W[2] = U[2] ^ V[2];
	W[3] = U[3] ^ V[3];
	W[4] = U[4] ^ V[4];
	W[5] = U[5] ^ V[5];
	W[6] = U[6] ^ V[6];
	W[7] = U[7] ^ V[7];

	P_GOST_3411_P (W, K[0])

	/* Generate second key: P (A (U) xor A^2 (V)) */
	W[0] = U[2] ^ V[4];
	W[1] = U[3] ^ V[5];
	W[2] = U[4] ^ V[6];
	W[3] = U[5] ^ V[7];
	W[4] = U[6] ^ (V[0] ^= V[2]);
	W[5] = U[7] ^ (V[1] ^= V[3]);
	W[6] = (U[0] ^= U[2]) ^ (V[2] ^= V[4]);
	W[7] = (U[1] ^= U[3]) ^ (V[3] ^= V[5]);

	P_GOST_3411_P (W, K[1])

	/* Generate third key: P ((A^2 (U) + C3) xor A^4 (V)) */
	/* C3 = FF00FFFF 000000FF FF0000FF 00FFFF00 00FF00FF 00FF00FF FF00FF00 FF00FF00 */
	U[2] ^= U[4] ^ 0x000000FF;
	U[3] ^= U[5] ^ 0xFF00FFFF;
	U[4] ^= 0xFF00FF00;
	U[5] ^= 0xFF00FF00;
	U[6] ^= 0x00FF00FF;
	U[7] ^= 0x00FF00FF;
	U[0] ^= 0x00FFFF00;
	U[1] ^= 0xFF0000FF;

	W[0] = U[4] ^ V[0];
	W[2] = U[6] ^ V[2];
	W[4] = U[0] ^ (V[4] ^= V[6]);
	W[6] = U[2] ^ (V[6] ^= V[0]);
	W[1] = U[5] ^ V[1];
	W[3] = U[7] ^ V[3];
	W[5] = U[1] ^ (V[5] ^= V[7]);
	W[7] = U[3] ^ (V[7] ^= V[1]);

	P_GOST_3411_P (W, K[2])

	/* Generate forth key: P (A (A^2 (U) xor C3) xor A^6 (V)) */
	W[0] = U[6] ^ V[4];
	W[1] = U[7] ^ V[5];
	W[2] = U[0] ^ V[6];
	W[3] = U[1] ^ V[7];
	W[4] = U[2] ^ (V[0] ^= V[2]);
	W[5] = U[3] ^ (V[1] ^= V[3]);
	W[6] = (U[4] ^= U[6]) ^ (V[2] ^= V[4]);
	W[7] = (U[5] ^= U[7]) ^ (V[3] ^= V[5]);

	P_GOST_3411_P (W, K[3])

	/* Perform GOST 28147-89 encryption */
	P_GOST_28147_E (ctx->hash,      K[0], S)
	P_GOST_28147_E (ctx->hash + 2,  K[1], S + 2)
	P_GOST_28147_E (ctx->hash + 4,  K[2], S + 4)
	P_GOST_28147_E (ctx->hash + 6,  K[3], S + 6)

	/* Step hash function: H (M, Hprev) = PSI^61 (Hprev xor PSI (M xor PSI^12 (S))) */

	/* (12 rounds of LFSR) xor M */
	U[0] = data[0] ^ S[6];

	U[1] = data[1] ^ S[7];

	U[2] = data[2] ^ (S[0] & 0x0000FFFF)	^ (S[0] >> 16) ^ (S[0] << 16)
		       ^ (S[1] & 0x0000FFFF)	^ (S[1] >> 16) ^ (S[2] << 16)
		       ^ (S[7] & 0xFFFF0000)	^ (S[6] << 16) ^ (S[7] >> 16)
		       ^  S[6];

	U[3] = data[3] ^ (S[0] & 0x0000FFFF)	^ (S[0] << 16) ^ (S[2] << 16)
		       ^ (S[1] & 0x0000FFFF)	^ (S[1] << 16) ^ (S[1] >> 16)
		       ^ (S[7] & 0x0000FFFF)	^ (S[2] >> 16) ^ (S[3] << 16)
		       ^ (S[6] << 16)		^ (S[6] >> 16) ^ (S[7] << 16)
		       ^ (S[7] >> 16)		^ S[6];

	U[4] = data[4] ^ (S[0] & 0xFFFF0000)	^ (S[0] << 16) ^ (S[0] >> 16)
		       ^ (S[1] & 0xFFFF0000)	^ (S[1] >> 16) ^ (S[2] << 16)
		       ^ (S[7] & 0x0000FFFF)	^ (S[3] << 16) ^ (S[3] >> 16)
		       ^ (S[4] << 16)		^ (S[6] << 16) ^ (S[6] >> 16)
		       ^ (S[2] >> 16)		^ (S[7] << 16) ^ (S[7] >> 16);

	U[5] = data[5] ^ (S[0] & 0xFFFF0000)	^ (S[0] >> 16) ^ (S[0] << 16)
		       ^ (S[1] & 0x0000FFFF)	^ (S[7] >> 16) ^ (S[2] >> 16)
		       ^ (S[7] & 0xFFFF0000)	^ (S[3] >> 16) ^ (S[4] << 16)
		       ^ (S[4] >> 16)		^ (S[5] << 16) ^ (S[6] << 16)
		       ^ (S[6] >> 16)		^ (S[3] << 16) ^ (S[7] << 16)
		       ^ S[2];

	U[6] = data[6] ^ (S[4] >> 16)		^ (S[1] >> 16) ^ (S[2] << 16)
		       ^ (S[7] << 16)		^ (S[3] >> 16) ^ (S[4] << 16)
		       ^ (S[5] << 16)		^ (S[5] >> 16) ^ (S[6] << 16)
		       ^ (S[6] >> 16)		^ S[6]	       ^ S[0]
		       ^ S[3];

	U[7] = data[7] ^ (S[0] & 0xFFFF0000)	^ (S[0] << 16) ^ (S[1] << 16)
		       ^ (S[1] & 0x0000FFFF)	^ (S[2] >> 16) ^ (S[3] << 16)
		       ^ (S[7] & 0x0000FFFF)	^ (S[4] >> 16) ^ (S[5] << 16)
		       ^ (S[5] >> 16)		^ (S[6] >> 16) ^ (S[7] << 16)
		       ^ (S[7] >> 16)		^ S[4];

	/* (1 round of LFSR) xor Hprev */
	V[0] = ctx->hash[0] ^ (U[1] << 16) ^ (U[0] >> 16);
	V[1] = ctx->hash[1] ^ (U[2] << 16) ^ (U[1] >> 16);
	V[2] = ctx->hash[2] ^ (U[3] << 16) ^ (U[2] >> 16);
	V[3] = ctx->hash[3] ^ (U[4] << 16) ^ (U[3] >> 16);
	V[4] = ctx->hash[4] ^ (U[5] << 16) ^ (U[4] >> 16);
	V[5] = ctx->hash[5] ^ (U[6] << 16) ^ (U[5] >> 16);
	V[6] = ctx->hash[6] ^ (U[7] << 16) ^ (U[6] >> 16);
	V[7] = ctx->hash[7] ^ (U[7] >> 16)
	     ^ (U[0] << 16) ^ (U[1] & 0xFFFF0000)
	     ^ (U[1] << 16) ^ (U[7] & 0xFFFF0000)
	     ^ (U[6] << 16) ^ (U[0] & 0xFFFF0000);

	/* Final 61 rounds of LFSR */
	ctx->hash[0] = (V[0] & 0xFFFF0000)	^ (V[0] << 16)	^ (V[0] >> 16)
		     ^ (V[1] & 0xFFFF0000)	^ (V[1] >> 16)	^ (V[2] << 16)
		     ^ (V[7] & 0x0000FFFF)	^ (V[3] >> 16)	^ (V[4] << 16)
		     ^ (V[5] >> 16)		^ (V[6] >> 16)	^ (V[7] << 16)
		     ^ (V[7] >> 16)		^ V[5];
	ctx->hash[1] = (V[0] & 0xFFFF0000)	^ (V[0] << 16)	^ (V[0] >> 16)
		     ^ (V[1] & 0x0000FFFF)	^ (V[2] >> 16)	^ (V[3] << 16)
		     ^ (V[7] & 0xFFFF0000)	^ (V[4] >> 16)	^ (V[5] << 16)
		     ^ (V[6] << 16)		^ (V[7] >> 16)	^ V[6]
		     ^ V[2] ;
	ctx->hash[2] = (V[0] & 0x0000FFFF)	^ (V[0] << 16)	^ (V[1] << 16)
		     ^ (V[7] & 0x0000FFFF)	^ (V[1] >> 16)	^ (V[2] << 16)
		     ^ (V[1] & 0xFFFF0000)	^ (V[3] >> 16)  ^ (V[4] << 16)
		     ^ (V[5] >> 16)		^ (V[6] >> 16)	^ (V[7] << 16)
		     ^ (V[7] >> 16)		^ V[3]		^ V[6];
	ctx->hash[3] = (V[0] & 0xFFFF0000)	^ (V[0] << 16)	^ (V[0] >> 16)
		     ^ (V[1] & 0xFFFF0000)	^ (V[1] >> 16)	^ (V[2] << 16)
		     ^ (V[7] & 0x0000FFFF)	^ (V[2] >> 16)	^ (V[3] << 16)
		     ^ (V[4] >> 16)		^ (V[5] << 16)	^ (V[6] << 16)
		     ^ (V[7] >> 16)		^ V[2]		^ V[4];
	ctx->hash[4] = (V[0] >> 16)		^ (V[1] << 16)  ^ (V[2] >> 16)
		     ^ (V[3] << 16)		^ (V[3] >> 16)	^ (V[4] << 16)
		     ^ (V[5] >> 16)		^ (V[6] << 16)	^ (V[6] >> 16)
		     ^ (V[7] << 16)		^ V[1]		^ V[2]
		     ^ V[3]			^ V[5];
	ctx->hash[5] = (V[0] & 0xFFFF0000)	^ (V[0] << 16)	^ (V[1] << 16)
		     ^ (V[1] & 0xFFFF0000) 	^ (V[1] >> 16)	^ (V[2] << 16)
		     ^ (V[7] & 0xFFFF0000)	^ (V[3] >> 16)  ^ (V[4] << 16)
		     ^ (V[4] >> 16)		^ (V[5] << 16)	^ (V[6] << 16)
		     ^ (V[6] >> 16)		^ (V[7] << 16)	^ (V[7] >> 16)
		     ^ V[2]			^ V[3]		^ V[4]
		     ^ V[6];
	ctx->hash[6] = (V[2] >> 16)		^ (V[3] << 16)	^ (V[4] >> 16)
		     ^ (V[5] << 16)		^ (V[5] >> 16)	^ (V[6] << 16)
		     ^ (V[6] >> 16)		^ (V[7] << 16)	^ V[7]
		     ^ V[0]			^ V[2]		^ V[3]
		     ^ V[4]			^ V[5]		^ V[6];
	ctx->hash[7] = (V[0] >> 16)		^ (V[1] << 16)	^ (V[1] >> 16)
		     ^ (V[2] << 16)		^ (V[3] >> 16)	^ (V[4] << 16)
		     ^ (V[5] >> 16)		^ (V[6] << 16)	^ (V[6] >> 16)
		     ^ (V[7] << 16)		^ V[7]		^ V[0]
		     ^ V[3]			^ V[4]		^ V[5];
}